

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcPile::~IfcPile(IfcPile *this)

{
  pointer pcVar1;
  undefined1 *puVar2;
  
  *(undefined8 *)this = 0x9a1f38;
  *(undefined8 *)&this->field_0x1a0 = 0x9a2050;
  *(undefined8 *)&this->field_0x88 = 0x9a1f60;
  *(undefined8 *)&this->field_0x98 = 0x9a1f88;
  *(undefined8 *)&this->field_0xd0 = 0x9a1fb0;
  *(undefined8 *)&this->field_0x100 = 0x9a1fd8;
  *(undefined8 *)&this->field_0x138 = 0x9a2000;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPile,_2UL>)._vptr_ObjectHelper =
       (_func_int **)0x9a2028;
  pcVar1 = (this->ConstructionType).ptr._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->ConstructionType).ptr.field_2) {
    operator_delete(pcVar1);
  }
  puVar2 = *(undefined1 **)
            &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPile,_2UL>).field_0x10;
  if (puVar2 != &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPile,_2UL>).field_0x20) {
    operator_delete(puVar2);
  }
  IfcElement::~IfcElement((IfcElement *)this,&PTR_construction_vtable_24__009a2070);
  operator_delete(this);
  return;
}

Assistant:

IfcPile() : Object("IfcPile") {}